

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_readwrite.c
# Opt level: O3

void glist_readatoms(_glist *x,int natoms,t_atom *vec,int *p_nextmsg,t_symbol *templatesym,t_word *w
                    ,int argc,t_atom *argv)

{
  int iVar1;
  int iVar2;
  _array *x_00;
  t_symbol *s;
  _binbuf *x_01;
  bool bVar3;
  t_atomtype tVar4;
  int iVar5;
  t_template *template;
  t_template *ptVar6;
  _binbuf *x_02;
  t_atom *argv_00;
  long lVar7;
  int *piVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  t_atomtype tVar12;
  t_atomtype tVar13;
  undefined4 in_register_00000034;
  long lVar14;
  t_atomtype tVar15;
  long lVar16;
  undefined4 in_stack_0000000c;
  t_atom *in_stack_ffffffffffffff60;
  
  lVar14 = CONCAT44(in_register_00000034,natoms);
  template = template_findbyname((t_symbol *)p_nextmsg);
  tVar12 = (t_atomtype)x;
  if (template == (t_template *)0x0) {
    pd_error((void *)0x0,"%s: no such template",*(undefined8 *)p_nextmsg);
    vec->a_type = tVar12;
  }
  else {
    word_restore((t_word *)templatesym,template,(int)w,(t_atom *)CONCAT44(in_stack_0000000c,argc));
    iVar1 = template->t_n;
    if (0 < (long)iVar1) {
      lVar9 = (long)(int)tVar12;
      lVar16 = 0;
      do {
        iVar5 = template->t_vec[lVar16].ds_type;
        if (iVar5 == 2) {
          x_02 = binbuf_new();
          tVar4 = vec->a_type;
          lVar11 = (long)(int)tVar4;
          tVar15 = tVar4;
          if ((int)tVar4 < (int)tVar12) {
            if (*(int *)(lVar14 + lVar11 * 0x10) == 4) {
              bVar3 = true;
            }
            else {
              piVar8 = (int *)(lVar11 * 0x10 + lVar14 + 0x10);
              lVar7 = 0;
              do {
                if ((1 - lVar9) + lVar11 == lVar7) {
                  bVar3 = false;
                  tVar15 = tVar12;
                  goto LAB_00150d81;
                }
                lVar7 = lVar7 + -1;
                iVar5 = *piVar8;
                piVar8 = piVar8 + 4;
              } while (iVar5 != 4);
              bVar3 = lVar11 - lVar7 < lVar9;
              tVar15 = tVar4 - (int)lVar7;
            }
          }
          else {
            bVar3 = false;
          }
LAB_00150d81:
          binbuf_restore(x_02,tVar15 - tVar4,(t_atom *)(lVar11 * 0x10 + lVar14));
          x_01 = (_binbuf *)(&templatesym->s_name)[lVar16];
          iVar5 = binbuf_getnatom(x_02);
          argv_00 = binbuf_getvec(x_02);
          binbuf_add(x_01,iVar5,argv_00);
          binbuf_free(x_02);
          tVar4 = tVar15 + A_FLOAT;
          if (!bVar3) {
            tVar4 = tVar12;
          }
          vec->a_type = tVar4;
        }
        else if (iVar5 == 3) {
          x_00 = (_array *)(&templatesym->s_name)[lVar16];
          iVar5 = x_00->a_elemsize;
          s = template->t_vec[lVar16].ds_arraytemplate;
          ptVar6 = template_findbyname(s);
          if (ptVar6 == (t_template *)0x0) {
            pd_error((void *)0x0,"%s: no such template",s->s_name);
          }
          else {
            tVar4 = vec->a_type;
            if ((int)tVar4 < (int)tVar12) {
              lVar11 = 0;
              do {
                lVar10 = (long)(int)tVar4;
                lVar7 = lVar10 * 0x10;
                if (*(int *)(lVar14 + lVar7) == 4) {
                  vec->a_type = tVar4 + A_FLOAT;
                  break;
                }
                piVar8 = (int *)(lVar7 + lVar14 + 0x10);
                tVar15 = tVar4;
                do {
                  lVar10 = lVar10 + 1;
                  tVar13 = tVar12;
                  if (tVar12 - A_FLOAT == tVar15) break;
                  tVar13 = tVar15 + A_FLOAT;
                  iVar2 = *piVar8;
                  piVar8 = piVar8 + 4;
                  tVar15 = tVar13;
                } while (iVar2 != 4);
                vec->a_type = (lVar10 < lVar9) + tVar13;
                if (tVar13 - tVar4 == 0) break;
                array_resize(x_00,(int)(lVar11 + 1));
                glist_readatoms((_glist *)((ulong)x & 0xffffffff),natoms,vec,(int *)s,
                                (t_symbol *)(x_00->a_vec + lVar11 * iVar5),
                                (t_word *)(ulong)(tVar13 - tVar4),natoms + (int)lVar7,
                                in_stack_ffffffffffffff60);
                tVar4 = vec->a_type;
                lVar11 = lVar11 + 1;
              } while ((int)tVar4 < (int)tVar12);
            }
          }
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != iVar1);
    }
  }
  return;
}

Assistant:

static void glist_readatoms(t_glist *x, int natoms, t_atom *vec,
    int *p_nextmsg, t_symbol *templatesym, t_word *w, int argc, t_atom *argv)
{
    int message, n, i;

    t_template *template = template_findbyname(templatesym);
    if (!template)
    {
        pd_error(0, "%s: no such template", templatesym->s_name);
        *p_nextmsg = natoms;
        return;
    }
    word_restore(w, template, argc, argv);
    n = template->t_n;
    for (i = 0; i < n; i++)
    {
        if (template->t_vec[i].ds_type == DT_ARRAY)
        {
            t_array *a = w[i].w_array;
            int elemsize = a->a_elemsize, nitems = 0;
            t_symbol *arraytemplatesym = template->t_vec[i].ds_arraytemplate;
            t_template *arraytemplate =
                template_findbyname(arraytemplatesym);
            if (!arraytemplate)
            {
                pd_error(0, "%s: no such template", arraytemplatesym->s_name);
            }
            else while (1)
            {
                t_word *element;
                int nline = canvas_scanbinbuf(natoms, vec, &message, p_nextmsg);
                    /* empty line terminates array */
                if (!nline)
                    break;
                array_resize(a, nitems + 1);
                element = (t_word *)(((char *)a->a_vec) +
                    nitems * elemsize);
                glist_readatoms(x, natoms, vec, p_nextmsg, arraytemplatesym,
                    element, nline, vec + message);
                nitems++;
            }
        }
        else if (template->t_vec[i].ds_type == DT_TEXT)
        {
            t_binbuf *z = binbuf_new();
            int first = *p_nextmsg, last;
            for (last = first; last < natoms && vec[last].a_type != A_SEMI;
                last++);
            binbuf_restore(z, last-first, vec+first);
            binbuf_add(w[i].w_binbuf, binbuf_getnatom(z), binbuf_getvec(z));
            binbuf_free(z);
            last++;
            if (last > natoms) last = natoms;
            *p_nextmsg = last;
        }
    }
}